

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O2

ssize_t uper_get_length(asn_per_data_t *pd,int ebits,int *repeat)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  *repeat = 0;
  if (ebits < 0) {
    uVar2 = per_get_few_bits(pd,8);
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      if ((char)uVar2 < '\0') {
        if ((uVar2 & 0x40) == 0) {
          uVar3 = per_get_few_bits(pd,8);
          if (-1 < (int)uVar3) {
            uVar4 = (ulong)((uVar2 & 0x3f) << 8 | uVar3);
          }
        }
        else if (0xfffffffffffffffb < (ulong)(uVar2 & 0x3f) - 5) {
          *repeat = 1;
          uVar4 = (ulong)((uVar2 & 0x3f) << 0xe);
        }
      }
      else {
        uVar4 = (ulong)(uVar2 & 0x7f);
      }
    }
  }
  else {
    iVar1 = per_get_few_bits(pd,ebits);
    uVar4 = (ulong)iVar1;
  }
  return uVar4;
}

Assistant:

ssize_t
uper_get_length(asn_per_data_t *pd, int ebits, int *repeat) {
	ssize_t value;

	*repeat = 0;

	if(ebits >= 0) return per_get_few_bits(pd, ebits);

	value = per_get_few_bits(pd, 8);
	if(value < 0) return -1;
	if((value & 128) == 0)	/* #10.9.3.6 */
		return (value & 0x7F);
	if((value & 64) == 0) {	/* #10.9.3.7 */
		value = ((value & 63) << 8) | per_get_few_bits(pd, 8);
		if(value < 0) return -1;
		return value;
	}
	value &= 63;	/* this is "m" from X.691, #10.9.3.8 */
	if(value < 1 || value > 4)
		return -1;
	*repeat = 1;
	return (16384 * value);
}